

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::IGXMLScanner::resizeRawAttrColonList(IGXMLScanner *this)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  uint local_24;
  uint index;
  int *newRawAttrColonList;
  uint newSize;
  IGXMLScanner *this_local;
  
  uVar3 = this->fRawAttrColonListSize << 1;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar3 << 2);
  for (local_24 = 0; local_24 < this->fRawAttrColonListSize; local_24 = local_24 + 1) {
    ((int *)CONCAT44(extraout_var,iVar2))[local_24] = this->fRawAttrColonList[local_24];
  }
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fRawAttrColonList);
  this->fRawAttrColonList = (int *)CONCAT44(extraout_var,iVar2);
  this->fRawAttrColonListSize = uVar3;
  return;
}

Assistant:

void IGXMLScanner::resizeRawAttrColonList() {

    unsigned int newSize = fRawAttrColonListSize * 2;
    int* newRawAttrColonList = (int*) fMemoryManager->allocate
    (
        newSize * sizeof(int)
    ); //new int[newSize];

    // Copy the existing values
    unsigned int index = 0;
    for (; index < fRawAttrColonListSize; index++)
        newRawAttrColonList[index] = fRawAttrColonList[index];

    // Delete the old array and udpate our members
    fMemoryManager->deallocate(fRawAttrColonList); //delete [] fRawAttrColonList;
    fRawAttrColonList = newRawAttrColonList;
    fRawAttrColonListSize = newSize;
}